

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

void __thiscall Js::IndexPropertyDescriptorMap::EnsureIndexList(IndexPropertyDescriptorMap *this)

{
  Type *addr;
  int iVar1;
  int iVar2;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  Recycler *this_00;
  undefined4 *puVar7;
  uint *puVar8;
  size_t __nmemb;
  size_t size;
  int iVar9;
  uint *puVar10;
  size_t sVar11;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if ((this->indexList).ptr == (uint *)0x0) {
    pBVar3 = (this->indexPropertyMap).ptr;
    iVar1 = pBVar3->count;
    iVar2 = pBVar3->freeCount;
    iVar9 = iVar1 - iVar2;
    __nmemb = (size_t)iVar9;
    local_60 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9b7fe41;
    data.filename._0_4_ = 0x3a;
    data.plusSize = __nmemb;
    this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    if (iVar1 == iVar2) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      puVar10 = (uint *)&DAT_00000008;
    }
    else {
      size = 0xffffffffffffffff;
      if (-1 < iVar9) {
        size = __nmemb * 4;
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        data._32_8_ = __tls_get_addr(&PTR_01548f08);
        *(undefined4 *)data._32_8_ = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00db3912;
        *(undefined4 *)data._32_8_ = 0;
      }
      puVar10 = (uint *)Memory::Recycler::
                        AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_00,size);
      if (puVar10 == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_00db3912:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
        puVar10 = (uint *)0x0;
      }
    }
    addr = &this->indexList;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->indexList).ptr = puVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->lastIndexAt = -1;
    if (iVar9 < 1) {
      puVar10 = addr->ptr;
    }
    else {
      sVar11 = 0;
      do {
        puVar8 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->indexPropertyMap).ptr,(int)sVar11);
        puVar10 = (this->indexList).ptr;
        puVar10[sVar11] = *puVar8;
        sVar11 = sVar11 + 1;
      } while (__nmemb != sVar11);
    }
    qsort(puVar10,__nmemb,4,CompareIndex);
  }
  return;
}

Assistant:

void IndexPropertyDescriptorMap::EnsureIndexList()
    {
        if (!indexList)
        {
            int length = Count();
            indexList = RecyclerNewArrayLeaf(recycler, uint32, length);
            lastIndexAt = -1; // Reset lastAccessorIndexAt

            for (int i = 0; i < length; i++)
            {
                indexList[i] = GetKeyAt(i);
            }

            ::qsort(indexList, length, sizeof(uint32), &CompareIndex);
        }
    }